

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

char * vkb::to_string_message_severity(VkDebugUtilsMessageSeverityFlagBitsEXT s)

{
  char *pcStack_10;
  VkDebugUtilsMessageSeverityFlagBitsEXT s_local;
  
  if (s == VK_DEBUG_UTILS_MESSAGE_SEVERITY_VERBOSE_BIT_EXT) {
    pcStack_10 = "VERBOSE";
  }
  else if (s == VK_DEBUG_UTILS_MESSAGE_SEVERITY_INFO_BIT_EXT) {
    pcStack_10 = "INFO";
  }
  else if (s == VK_DEBUG_UTILS_MESSAGE_SEVERITY_WARNING_BIT_EXT) {
    pcStack_10 = "WARNING";
  }
  else if (s == VK_DEBUG_UTILS_MESSAGE_SEVERITY_ERROR_BIT_EXT) {
    pcStack_10 = "ERROR";
  }
  else {
    pcStack_10 = "UNKNOWN";
  }
  return pcStack_10;
}

Assistant:

const char* to_string_message_severity(VkDebugUtilsMessageSeverityFlagBitsEXT s) {
    switch (s) {
        case VK_DEBUG_UTILS_MESSAGE_SEVERITY_VERBOSE_BIT_EXT:
            return "VERBOSE";
        case VK_DEBUG_UTILS_MESSAGE_SEVERITY_ERROR_BIT_EXT:
            return "ERROR";
        case VK_DEBUG_UTILS_MESSAGE_SEVERITY_WARNING_BIT_EXT:
            return "WARNING";
        case VK_DEBUG_UTILS_MESSAGE_SEVERITY_INFO_BIT_EXT:
            return "INFO";
        default:
            return "UNKNOWN";
    }
}